

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Client_deleteMembers(UA_Client *client)

{
  UA_Client_NotificationsAckNumber *pUVar1;
  UA_Client_NotificationsAckNumber **ppUVar2;
  UA_Client_Subscription *pUVar3;
  UA_Client_Subscription *sub;
  UA_Client_NotificationsAckNumber *__ptr;
  UA_Client *client_00;
  
  UA_Client_disconnect(client);
  UA_SecureChannel_deleteMembersCleanup(&client->channel);
  UA_ByteString_deleteMembers(&(client->connection).incompleteMessage);
  if ((client->endpointUrl).data != (UA_Byte *)0x0) {
    UA_String_deleteMembers(&client->endpointUrl);
  }
  UA_deleteMembers(&client->token,UA_TYPES + 0x65);
  UA_NodeId_deleteMembers(&client->authenticationToken);
  if ((client->username).data != (UA_Byte *)0x0) {
    UA_String_deleteMembers(&client->username);
  }
  if ((client->password).data != (UA_Byte *)0x0) {
    UA_String_deleteMembers(&client->password);
  }
  __ptr = (client->pendingNotificationsAcks).lh_first;
  while (__ptr != (UA_Client_NotificationsAckNumber *)0x0) {
    pUVar1 = (__ptr->listEntry).le_next;
    ppUVar2 = (__ptr->listEntry).le_prev;
    if (pUVar1 != (UA_Client_NotificationsAckNumber *)0x0) {
      (pUVar1->listEntry).le_prev = ppUVar2;
    }
    *ppUVar2 = pUVar1;
    free(__ptr);
    __ptr = pUVar1;
  }
  client_00 = (UA_Client *)0x0;
  sub = (client->subscriptions).lh_first;
  while (sub != (UA_Client_Subscription *)0x0) {
    pUVar3 = (sub->listEntry).le_next;
    UA_Client_Subscriptions_forceDelete(client_00,sub);
    sub = pUVar3;
  }
  return;
}

Assistant:

static void UA_Client_deleteMembers(UA_Client* client) {
    UA_Client_disconnect(client);
    UA_SecureChannel_deleteMembersCleanup(&client->channel);
    UA_Connection_deleteMembers(&client->connection);
    if(client->endpointUrl.data)
        UA_String_deleteMembers(&client->endpointUrl);
    UA_UserTokenPolicy_deleteMembers(&client->token);
    UA_NodeId_deleteMembers(&client->authenticationToken);
    if(client->username.data)
        UA_String_deleteMembers(&client->username);
    if(client->password.data)
        UA_String_deleteMembers(&client->password);
#ifdef UA_ENABLE_SUBSCRIPTIONS
    UA_Client_NotificationsAckNumber *n, *tmp;
    LIST_FOREACH_SAFE(n, &client->pendingNotificationsAcks, listEntry, tmp) {
        LIST_REMOVE(n, listEntry);
        UA_free(n);
    }
    UA_Client_Subscription *sub, *tmps;
    LIST_FOREACH_SAFE(sub, &client->subscriptions, listEntry, tmps)
        UA_Client_Subscriptions_forceDelete(client, sub); /* force local removal */
#endif
}